

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TType::isImage(TType *this)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_11;
  TType *this_local;
  
  local_11 = false;
  if ((*(uint *)&this->field_0x8 & 0xff) == 0xe) {
    iVar1 = (*this->_vptr_TType[8])();
    local_11 = TSampler::isImage((TSampler *)CONCAT44(extraout_var,iVar1));
  }
  return local_11;
}

Assistant:

virtual bool isImage() const { return basicType == EbtSampler && getSampler().isImage(); }